

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoaderThread.cpp
# Opt level: O2

void __thiscall LoaderThread::Launch(LoaderThread *this,char *filename,uint32_t octree_level)

{
  uint32_t local_54;
  char *local_50;
  promise<std::shared_ptr<OctreeBuilder>_> local_48;
  LoaderThread *local_30;
  thread local_28;
  
  if ((this->m_thread)._M_id._M_thread == 0) {
    local_54 = octree_level;
    local_50 = filename;
    std::promise<std::shared_ptr<OctreeBuilder>_>::promise(&local_48);
    std::promise<std::shared_ptr<OctreeBuilder>_>::operator=(&this->m_promise,&local_48);
    std::promise<std::shared_ptr<OctreeBuilder>_>::~promise(&local_48);
    std::__basic_future<std::shared_ptr<OctreeBuilder>_>::__basic_future
              ((__basic_future<std::shared_ptr<OctreeBuilder>_> *)&local_48,
               &(this->m_promise)._M_future);
    std::future<std::shared_ptr<OctreeBuilder>_>::operator=
              (&this->m_future,(future<std::shared_ptr<OctreeBuilder>_> *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48._M_future.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_48._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)thread_func;
    local_48._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_30 = this;
    std::thread::
    thread<void(LoaderThread::*)(char_const*,unsigned_int),LoaderThread*,char_const*&,unsigned_int&,void>
              (&local_28,(type *)&local_48,&local_30,&local_50,&local_54);
    std::thread::operator=(&this->m_thread,&local_28);
    std::thread::~thread(&local_28);
  }
  return;
}

Assistant:

void LoaderThread::Launch(const char *filename, uint32_t octree_level) {
	if (IsRunning())
		return;
	m_promise = std::promise<std::shared_ptr<OctreeBuilder>>();
	m_future = m_promise.get_future();
	m_thread = std::thread(&LoaderThread::thread_func, this, filename, octree_level);
}